

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O3

PosFilter *
indirect_filter(PosFilter *__return_storage_ptr__,Ray *r,Random *rng,int depth,int maxdepth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  pointer pSVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  long lVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar16;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  double dVar19;
  undefined4 uVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double pdf;
  Vector nl;
  Vector v;
  PosFilter res;
  Vector wi;
  double local_178;
  undefined8 uStack_170;
  double local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  double local_118;
  undefined8 uStack_110;
  Vector local_108;
  Vector local_e8;
  PosFilter local_c8;
  undefined1 local_98 [16];
  double local_88;
  Vector local_80;
  Ray local_68;
  
  iVar9 = (int)((long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                      super__Vector_impl_data._M_start >> 4) * -0x49249249;
  if (iVar9 != 0) {
    lVar12 = (long)iVar9;
    dVar24 = 1e+20;
    lVar13 = lVar12 * 0x70;
    iVar11 = 0;
    uVar18 = 0;
    uVar23 = 0;
    do {
      iVar9 = iVar9 + -1;
      dVar19 = Sphere::Intersect((Sphere *)
                                 ((long)&spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].c.x + lVar13)
                                 ,r);
      uVar14 = SUB84(dVar19,0);
      uVar15 = (undefined4)((ulong)dVar19 >> 0x20);
      uVar16 = extraout_XMM0_Dc;
      uVar17 = extraout_XMM0_Dd;
      iVar7 = iVar9;
      if (dVar19 == 0.0 || dVar24 <= dVar19) {
        uVar14 = SUB84(dVar24,0);
        uVar15 = (undefined4)((ulong)dVar24 >> 0x20);
        uVar16 = uVar18;
        uVar17 = uVar23;
        iVar7 = iVar11;
      }
      dVar24 = (double)CONCAT44(uVar15,uVar14);
      lVar12 = lVar12 + -1;
      lVar13 = lVar13 + -0x70;
      iVar11 = iVar7;
      uVar18 = uVar16;
      uVar23 = uVar17;
    } while (lVar12 != 0);
    if ((double)CONCAT44(uVar15,uVar14) <= 1e+20 && (double)CONCAT44(uVar15,uVar14) != 1e+20) {
      dVar24 = (r->d).z;
      uStack_110 = CONCAT44(uVar17,uVar16);
      dVar5 = (r->d).x;
      dVar6 = (r->d).y;
      local_118 = (double)CONCAT44(uVar15,uVar14) * dVar24 + (r->o).z;
      local_108.z = local_118 -
                    spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar7].c.z;
      dVar19 = (double)CONCAT44(uVar15,uVar14) * dVar5 + (r->o).x;
      dVar4 = (double)CONCAT44(uVar15,uVar14) * dVar6 + (r->o).y;
      uVar18 = (undefined4)((ulong)dVar4 >> 0x20);
      auVar20._0_8_ =
           dVar19 - spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar7].c.x;
      auVar20._8_8_ =
           dVar4 - spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar7].c.y;
      dVar26 = SQRT(local_108.z * local_108.z +
                    auVar20._0_8_ * auVar20._0_8_ + auVar20._8_8_ * auVar20._8_8_);
      local_108.z = local_108.z / dVar26;
      auVar21._8_8_ = dVar26;
      auVar21._0_8_ = dVar26;
      auVar21 = divpd(auVar20,auVar21);
      dVar26 = auVar21._0_8_;
      dVar22 = auVar21._8_8_;
      dVar24 = dVar24 * local_108.z + dVar6 * dVar22 + dVar26 * dVar5;
      uVar10 = (uint)(dVar24 < 0.0);
      auVar25._0_8_ = CONCAT44((int)(uVar10 << 0x1f) >> 0x1f,(int)(uVar10 << 0x1f) >> 0x1f);
      auVar25._8_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      auVar25._12_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      local_108.x = (double)(~auVar25._0_8_ & (ulong)-dVar26 | (ulong)dVar26 & auVar25._0_8_);
      local_108.y = (double)(~auVar25._8_8_ & (ulong)-dVar22 | (ulong)dVar22 & auVar25._8_8_);
      if (0.0 <= dVar24) {
        local_108.z = -local_108.z;
      }
      if (depth < maxdepth) {
        pSVar8 = spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar7;
        local_128._8_4_ = SUB84(dVar4,0);
        local_128._0_8_ = dVar19;
        local_128._12_4_ = uVar18;
        dVar24 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&rng->_gen);
        local_138._8_4_ = extraout_XMM0_Dc_00;
        local_138._0_8_ = dVar24;
        local_138._12_4_ = extraout_XMM0_Dd_00;
        local_178 = (rng->_dist)._M_param._M_a;
        dVar24 = (rng->_dist)._M_param._M_b;
        dVar19 = std::
                 generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                           (&rng->_gen);
        local_148._8_4_ = extraout_XMM0_Dc_01;
        local_148._0_8_ = dVar19;
        local_148._12_4_ = extraout_XMM0_Dd_01;
        dVar19 = (rng->_dist)._M_param._M_b;
        dVar4 = (rng->_dist)._M_param._M_a;
        uStack_170._0_4_ = SUB84(dVar4,0);
        uStack_170._4_4_ = (int)((ulong)dVar4 >> 0x20);
        dVar4 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&rng->_gen);
        local_88 = (rng->_dist)._M_param._M_a;
        local_88 = ((rng->_dist)._M_param._M_b - local_88) * dVar4 + local_88;
        uStack_170 = (double)local_148._0_8_ * (dVar19 - uStack_170) + uStack_170;
        local_98._8_4_ = SUB84(uStack_170,0);
        local_98._0_8_ = (double)local_138._0_8_ * (dVar24 - local_178) + local_178;
        local_98._12_4_ = (int)((ulong)uStack_170 >> 0x20);
        local_e8.x._0_4_ = *(undefined4 *)&(r->d).x;
        local_e8.y._0_4_ = *(undefined4 *)&(r->d).y;
        local_e8.x._4_4_ = *(uint *)((long)&(r->d).x + 4) ^ 0x80000000;
        local_e8.y._4_4_ = *(uint *)((long)&(r->d).y + 4) ^ 0x80000000;
        local_e8.z = -(r->d).z;
        Material::Sample(&local_80,&pSVar8->mat,&local_e8,&local_108,(Vector *)local_98,&local_150);
        dVar24 = local_80.z * local_108.z + local_80.x * local_108.x + local_80.y * local_108.y;
        Material::Reflectance(&local_c8.first,&pSVar8->mat,&local_80,&local_e8,&local_108);
        dVar19 = local_c8.first.z * dVar24;
        dVar4 = dVar24 * local_c8.first.x;
        auVar1._8_4_ = SUB84(dVar24 * local_c8.first.y,0);
        auVar1._0_8_ = dVar4;
        auVar1._12_4_ = (int)((ulong)(dVar24 * local_c8.first.y) >> 0x20);
        local_68.o.x = (double)local_128._0_8_;
        local_68.o.y = (double)local_128._8_8_;
        local_68.o.z = local_118;
        local_68.d.x = local_80.x;
        local_68.d.y = local_80.y;
        local_68.d.z = local_80.z;
        indirect_filter(&local_c8,&local_68,rng,depth + 1,maxdepth);
        local_150 = 1.0 / local_150;
        uStack_170 = auVar1._8_8_;
        dVar19 = dVar19 * local_c8.second.z * local_150;
        dVar24 = local_150 * local_c8.second.x * dVar4;
        local_150 = local_150 * local_c8.second.y * uStack_170;
        (__return_storage_ptr__->first).z = local_c8.first.z;
        (__return_storage_ptr__->first).x = local_c8.first.x;
        (__return_storage_ptr__->first).y = local_c8.first.y;
      }
      else {
        auVar3._8_4_ = SUB84(dVar4,0);
        auVar3._0_8_ = dVar19;
        auVar3._12_4_ = uVar18;
        (__return_storage_ptr__->first).x = dVar19;
        (__return_storage_ptr__->first).y = (double)auVar3._8_8_;
        (__return_storage_ptr__->first).z = local_118;
        dVar24 = 1.0;
        local_150 = 1.0;
        dVar19 = 1.0;
      }
      auVar2._8_4_ = SUB84(local_150,0);
      auVar2._0_8_ = dVar24;
      auVar2._12_4_ = (int)((ulong)local_150 >> 0x20);
      (__return_storage_ptr__->second).x = dVar24;
      (__return_storage_ptr__->second).y = (double)auVar2._8_8_;
      (__return_storage_ptr__->second).z = dVar19;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->second).y = 0.0;
  (__return_storage_ptr__->second).z = 0.0;
  (__return_storage_ptr__->first).z = 0.0;
  (__return_storage_ptr__->second).x = 0.0;
  (__return_storage_ptr__->first).x = 0.0;
  (__return_storage_ptr__->first).y = 0.0;
  return __return_storage_ptr__;
}

Assistant:

PosFilter indirect_filter(const Ray &r, Random& rng, int depth, int maxdepth=2){
   double t;                               // distance to Intersection
   int id=0;                               // id of Intersected object
   if (!Intersect(spheres, r, t, id)) return PosFilter(Vector(), Vector()); // if miss, return black
   const Sphere&   obj = spheres[id];      // the hit object
   const Material& mat = obj.mat;          // Its material
   Vector x  = r.o+r.d*t,
          n  = (x-obj.c).Normalize(),
          nl = Vector::Dot(n,r.d) < 0 ? n:n*-1;

   // Once you reach the max depth, return the hit position and the filter's
   // value using the recursive form.
   if(depth >= maxdepth) {
      return PosFilter(x, Vector(1.0f, 1.0f, 1.0f));

   // Main covariance computation. First this code generate a new direction
   // and query the covariance+radiance in that direction. Then, it computes
   // the covariance after the reflection/refraction.
   } else {
      /* Sampling a new direction + recursive call */
      double pdf;
      const auto e   = Vector(rng(), rng(), rng());
      const auto wo  = -r.d;
      const auto wi  = mat.Sample(wo, nl, e, pdf);
            auto f   = Vector::Dot(wi, nl)*mat.Reflectance(wi, wo, nl);
      const auto res = indirect_filter(Ray(x, wi), rng, depth+1, maxdepth);
      return PosFilter(res.first, (1.f/pdf) * f.Multiply(res.second));
   }
}